

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
::init_internal(btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *this,field_type position,
               btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               *parent)

{
  field_type i;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  **m;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *parent_local;
  field_type position_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *this_local;
  
  init_leaf(this,position,'\n',parent);
  set_max_count(this,'\0');
  i = start(this);
  m = mutable_child(this,i);
  SanitizerPoisonMemoryRegion(m,0x58);
  return;
}

Assistant:

void init_internal(field_type position, btree_node *parent) {
    init_leaf(position, kNodeSlots, parent);
    // Set `max_count` to a sentinel value to indicate that this node is
    // internal.
    set_max_count(kInternalNodeMaxCount);
    absl::container_internal::SanitizerPoisonMemoryRegion(
        &mutable_child(start()), (kNodeSlots + 1) * sizeof(btree_node *));
  }